

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O1

bool loadColormapTexture(void)

{
  GLboolean GVar1;
  bool bVar2;
  GLenum GVar3;
  djg_texture *texture;
  
  fwrite("Loading {Colormap-Texture}\n",0x1b,1,_stdout);
  fflush(_stdout);
  if (g_sphere.shading.pathToCmap != (char *)0x0) {
    GVar1 = (*glad_glIsTexture)(g_gl.textures[4]);
    if (GVar1 != '\0') {
      (*glad_glDeleteTextures)(1,g_gl.textures + 4);
    }
    (*glad_glGenTextures)(1,g_gl.textures + 4);
    texture = (djg_texture *)malloc(0x20);
    texture->next = (djg_texture *)0x0;
    texture->texels = (char *)0x0;
    texture->x = 0;
    texture->y = 0;
    texture->comp = 0;
    texture->pf = 0;
    (*glad_glActiveTexture)(0x84c4);
    djgt_push_image_u8(texture,g_sphere.shading.pathToCmap,false);
    bVar2 = djgt_to_gl(texture,0xde0,0x8058,true,false,g_gl.textures + 4);
    if (bVar2) {
      (*glad_glTexParameteri)(0xde0,0x2801,0x2601);
      (*glad_glTexParameteri)(0xde0,0x2802,0x812f);
      (*glad_glActiveTexture)(0x84c0);
    }
    else {
      fwrite("=> Failure <=\n",0xe,1,_stdout);
      fflush(_stdout);
    }
    djgt_release(texture);
    if (!bVar2) {
      return false;
    }
  }
  GVar3 = (*glad_glGetError)();
  return GVar3 == 0;
}

Assistant:

bool loadColormapTexture()
{
    LOG("Loading {Colormap-Texture}\n");
    if (g_sphere.shading.pathToCmap) {
        char buf[1024];

        if (glIsTexture(g_gl.textures[TEXTURE_CMAP]))
            glDeleteTextures(1, &g_gl.textures[TEXTURE_CMAP]);
        glGenTextures(1, &g_gl.textures[TEXTURE_CMAP]);

        djg_texture *djgt = djgt_create(0);
        GLuint *glt = &g_gl.textures[TEXTURE_CMAP];

        glActiveTexture(GL_TEXTURE0 + TEXTURE_CMAP);
        djgt_push_image_u8(djgt, g_sphere.shading.pathToCmap, false);

        if (!djgt_to_gl(djgt, GL_TEXTURE_1D, GL_RGBA8, 1, 0, glt)) {
            LOG("=> Failure <=\n");
            djgt_release(djgt);

            return false;
        }
        glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
        glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
        glActiveTexture(GL_TEXTURE0);

        djgt_release(djgt);
    }

    return (glGetError() == GL_NO_ERROR);
}